

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O2

void cppjieba::GetWordsFromWordRanges
               (string *s,vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *wrs,
               vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words)

{
  pointer pWVar1;
  ulong uVar2;
  long lVar3;
  Word local_60;
  
  lVar3 = 8;
  for (uVar2 = 0;
      pWVar1 = (wrs->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(wrs->
                            super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4);
      uVar2 = uVar2 + 1) {
    GetWordFromRunes(&local_60,s,*(const_iterator *)((long)pWVar1 + lVar3 + -8),
                     *(const_iterator *)((long)&pWVar1->left + lVar3));
    std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::emplace_back<cppjieba::Word>
              (words,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

inline void GetWordsFromWordRanges(const string& s, const vector<WordRange>& wrs, vector<Word>& words) {
  for (size_t i = 0; i < wrs.size(); i++) {
    words.push_back(GetWordFromRunes(s, wrs[i].left, wrs[i].right));
  }
}